

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O0

void leftRightProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *leftOperand,CTemp *rightOperand,bool shouldLoadLeft,bool shouldStoreLeft)

{
  bool bVar1;
  pointer ppVar2;
  char local_1a1;
  undefined1 local_1a0 [16];
  CTemp local_190;
  undefined1 local_170 [24];
  CTemp leftTemp;
  CTemp local_138;
  undefined1 local_118 [24];
  CTemp rightTemp;
  CTemp local_e0;
  _Self local_c0;
  iterator rightFind;
  _Self local_98;
  iterator leftFind;
  undefined1 local_80 [8];
  string rightName;
  undefined1 local_60 [8];
  string leftName;
  bool shouldStoreLeft_local;
  bool shouldLoadLeft_local;
  CTemp *rightOperand_local;
  CTemp *leftOperand_local;
  shared_ptr<AssemblyCode::AssemblyCommand> *thisShared_local;
  CTemp *beginSP_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *spilledToOffset_local;
  AssemblyCommands *newAssemblyCommands_local;
  
  local_1a1 = '\x01';
  if (!shouldLoadLeft) {
    local_1a1 = shouldStoreLeft;
  }
  if (local_1a1 != '\0') {
    IRT::CTemp::ToString_abi_cxx11_((CTemp *)local_60);
    IRT::CTemp::ToString_abi_cxx11_((CTemp *)local_80);
    IRT::CTemp::ToString_abi_cxx11_((CTemp *)&rightFind);
    local_98._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(spilledToOffset,(key_type *)&rightFind);
    std::__cxx11::string::~string((string *)&rightFind);
    IRT::CTemp::ToString_abi_cxx11_(&local_e0);
    local_c0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(spilledToOffset,&local_e0.name);
    std::__cxx11::string::~string((string *)&local_e0);
    rightTemp._24_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(spilledToOffset);
    bVar1 = std::operator!=(&local_c0,(_Self *)&rightTemp.field_0x18);
    if (bVar1) {
      IRT::CTemp::CTemp((CTemp *)(local_118 + 0x10));
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_c0);
      createLoad((CTemp *)local_118,(int)local_118 + 0x10,(CTemp *)(ulong)(uint)ppVar2->second);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,(value_type *)local_118);
      std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
                ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_118);
      IRT::CTemp::ToString_abi_cxx11_(&local_138);
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      IRT::CTemp::~CTemp((CTemp *)(local_118 + 0x10));
    }
    leftTemp._24_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(spilledToOffset);
    bVar1 = std::operator!=(&local_98,(_Self *)&leftTemp.field_0x18);
    if (bVar1) {
      IRT::CTemp::CTemp((CTemp *)(local_170 + 0x10));
      if (shouldLoadLeft) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->(&local_98);
        createLoad((CTemp *)local_170,(int)local_170 + 0x10,(CTemp *)(ulong)(uint)ppVar2->second);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
        ::push_back(newAssemblyCommands,(value_type *)local_170);
        std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
                  ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_170);
      }
      IRT::CTemp::ToString_abi_cxx11_(&local_190);
      std::__cxx11::string::operator=((string *)local_60,(string *)&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,thisShared);
      if (shouldStoreLeft) {
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
                 ::operator->(&local_98);
        createStore((CTemp *)local_1a0,(int)local_170 + 0x10,(CTemp *)(ulong)(uint)ppVar2->second);
        std::
        vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
        ::push_back(newAssemblyCommands,(value_type *)local_1a0);
        std::shared_ptr<AssemblyCode::AssemblyCommand>::~shared_ptr
                  ((shared_ptr<AssemblyCode::AssemblyCommand> *)local_1a0);
      }
      IRT::CTemp::~CTemp((CTemp *)(local_170 + 0x10));
    }
    else {
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
      ::push_back(newAssemblyCommands,thisShared);
    }
    IRT::CTemp::setName(leftOperand,(string *)local_60);
    IRT::CTemp::setName(rightOperand,(string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)local_60);
    return;
  }
  __assert_fail("shouldLoadLeft || shouldStoreLeft",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Izeren[P]mini-java-compilator/src/IRT/utils/AssemblyCommand.cpp"
                ,0x1a,
                "void leftRightProcessMemoryTemps(AssemblyCommands &, std::map<std::string, int> &, IRT::CTemp &, std::shared_ptr<AssemblyCode::AssemblyCommand>, IRT::CTemp &, IRT::CTemp &, bool, bool)"
               );
}

Assistant:

void leftRightProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& leftOperand,
                                 IRT::CTemp& rightOperand,
                                 bool shouldLoadLeft = true,
                                 bool shouldStoreLeft = true) {

    assert(shouldLoadLeft || shouldStoreLeft);

    std::string leftName = leftOperand.ToString();
    std::string rightName = rightOperand.ToString();

    auto leftFind = spilledToOffset.find(leftOperand.ToString());
    auto rightFind = spilledToOffset.find(rightOperand.ToString());

    if (rightFind != spilledToOffset.end()) {
        IRT::CTemp rightTemp;
        newAssemblyCommands.push_back(createLoad(rightTemp, rightFind->second, beginSP));

        rightName = rightTemp.ToString();
    }

    if (leftFind != spilledToOffset.end()) {
        IRT::CTemp leftTemp;
        if (shouldLoadLeft) {
            newAssemblyCommands.push_back( createLoad( leftTemp, leftFind->second, beginSP ));
        }
        leftName = leftTemp.ToString( );

        newAssemblyCommands.push_back(thisShared);

        if (shouldStoreLeft) {
            newAssemblyCommands.push_back( createStore( leftTemp, leftFind->second, beginSP ));
        }
    } else {
        newAssemblyCommands.push_back(thisShared);
    }

    leftOperand.setName(leftName);
    rightOperand.setName(rightName);
}